

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O3

shared_ptr<QPDFCryptoImpl> __thiscall
QPDFCryptoProvider::getImpl_internal(QPDFCryptoProvider *this,string *name)

{
  pointer pcVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  logic_error *this_00;
  long *plVar4;
  long *plVar5;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFCryptoImpl> sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
                  *)((name->_M_dataplus)._M_p + 0x20),in_RDX);
  pcVar1 = (name->_M_dataplus)._M_p;
  if (iVar2._M_node == (_Base_ptr)(pcVar1 + 0x28)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_60,"QPDFCryptoProvider requested unknown implementation \"",in_RDX);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_40 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_40 == plVar5) {
      local_30 = *plVar5;
      lStack_28 = plVar4[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar5;
    }
    local_38 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
                         *)(pcVar1 + 0x20),in_RDX);
  if ((pmVar3->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*pmVar3->_M_invoker)((_Any_data *)this);
    sVar6.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<QPDFCryptoImpl>)
           sVar6.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::shared_ptr<QPDFCryptoImpl>
QPDFCryptoProvider::getImpl_internal(std::string const& name) const
{
    auto iter = m->providers.find(name);
    if (iter == m->providers.end()) {
        throw std::logic_error(
            "QPDFCryptoProvider requested unknown implementation \"" + name + "\"");
    }
    return m->providers[name]();
}